

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O2

void cmAppend<char,std::_Deque_iterator<char,char&,char*>>
               (vector<char,_std::allocator<char>_> *v,_Deque_iterator<char,_char_&,_char_*> *first,
               _Deque_iterator<char,_char_&,_char_*> *last)

{
  _Deque_iterator<char,_char_&,_char_*> local_48;
  _Deque_iterator<char,_char_&,_char_*> local_28;
  
  local_28._M_cur = first->_M_cur;
  local_28._M_first = first->_M_first;
  local_28._M_last = first->_M_last;
  local_28._M_node = first->_M_node;
  local_48._M_cur = last->_M_cur;
  local_48._M_first = last->_M_first;
  local_48._M_last = last->_M_last;
  local_48._M_node = last->_M_node;
  std::vector<char,std::allocator<char>>::insert<std::_Deque_iterator<char,char&,char*>,void>
            ((vector<char,std::allocator<char>> *)v,
             (const_iterator)
             (v->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish,&local_28,&local_48);
  return;
}

Assistant:

void cmAppend(std::vector<T>& v, InputIt first, InputIt last)
{
  v.insert(v.end(), first, last);
}